

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  uchar *puVar3;
  secp256k1_musig_pubnonce *pubnonce_00;
  secp256k1_keyagg_cache_internal *psVar4;
  secp256k1_musig_secnonce *pub;
  secp256k1_keyagg_cache_internal *psVar5;
  uchar *pk33;
  secp256k1_pubkey *msg32_00;
  bool bVar6;
  secp256k1_pubkey *r;
  secp256k1_musig_secnonce *psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  secp256k1_scalar sk;
  size_t pk_ser_len;
  uchar pk_ser [33];
  secp256k1_scalar k [2];
  uchar aggpk_ser [32];
  secp256k1_ge pk;
  secp256k1_ge nonce_pts [2];
  secp256k1_gej nonce_ptj [2];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  ulong auStack_510 [10];
  secp256k1_pubkey sStack_4c0;
  secp256k1_musig_pubnonce *psStack_478;
  uchar *puStack_470;
  secp256k1_pubkey *psStack_468;
  secp256k1_context *psStack_460;
  secp256k1_musig_secnonce *psStack_458;
  secp256k1_keyagg_cache_internal *psStack_450;
  undefined4 uStack_440;
  uint local_43c;
  uchar *local_438;
  secp256k1_scalar local_428;
  undefined8 local_408;
  undefined8 local_400;
  size_t local_3f8;
  secp256k1_musig_secnonce *local_3f0;
  undefined1 local_3e8 [52];
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  undefined1 local_398 [64];
  secp256k1_keyagg_cache_internal local_358;
  undefined1 local_238 [208];
  undefined1 local_168 [312];
  
  local_3f8 = 0x21;
  if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x1265fa;
    secp256k1_musig_nonce_gen_internal_cold_7();
    return 0;
  }
  psStack_450 = (secp256k1_keyagg_cache_internal *)0x12624e;
  pk33 = seckey;
  msg32_00 = pubkey;
  memset(pubnonce,0,0x84);
  if (pubkey == (secp256k1_pubkey *)0x0) {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x126604;
    secp256k1_musig_nonce_gen_internal_cold_6();
    return 0;
  }
  if ((ctx->ecmult_gen_ctx).built == 0) {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x12660e;
    secp256k1_musig_nonce_gen_internal_cold_5();
    return 0;
  }
  local_3f0 = secnonce;
  if (seckey == (uchar *)0x0) {
    local_43c = 1;
  }
  else {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x126283;
    local_43c = secp256k1_scalar_set_b32_seckey(&local_428,seckey);
    local_428.d[0] = 0;
    local_428.d[1] = 0;
    local_428.d[2] = 0;
    local_428.d[3] = 0;
    local_358.pk.x.n[0] = 0x4d430001;
    local_358.pk.x.n[2] = 0x20;
    local_358.pk.x.n[3] = 0;
    local_358.pk.x.n[4] = 0;
    local_358.pk.x.magnitude = 0;
    local_358.pk.x.normalized = 0;
    local_3e8[0] = '\0';
    local_3e8[1] = '\0';
    local_3e8[2] = '\0';
    local_3e8[3] = '\0';
    local_3e8[4] = '\0';
    local_3e8[5] = '\0';
    local_3e8[6] = '\0';
    local_3e8[7] = '\0';
    local_358.pk.x.n[1] = (uint64_t)&local_428;
  }
  psVar7 = (secp256k1_musig_secnonce *)0x0;
  if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
    r = (secp256k1_pubkey *)0x0;
  }
  else {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x126300;
    iVar2 = secp256k1_keyagg_cache_load(ctx,&local_358,keyagg_cache);
    if (iVar2 == 0) {
      return 0;
    }
    r = (secp256k1_pubkey *)(local_398 + 0x20);
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x126320;
    secp256k1_fe_get_b32((uchar *)r,(secp256k1_fe *)&local_358);
  }
  psStack_450 = (secp256k1_keyagg_cache_internal *)0x126338;
  iVar2 = secp256k1_pubkey_load(ctx,&local_358.pk,pubkey);
  if (iVar2 == 0) {
    return 0;
  }
  psVar5 = &local_358;
  pub = (secp256k1_musig_secnonce *)local_3e8;
  puVar3 = (uchar *)0x1;
  psStack_450 = (secp256k1_keyagg_cache_internal *)0x12635c;
  iVar2 = secp256k1_eckey_pubkey_serialize(&psVar5->pk,(uchar *)pub,&local_3f8,1);
  if (iVar2 == 0) {
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x12662b;
    secp256k1_musig_nonce_gen_internal_cold_4();
LAB_0012662b:
    input_nonce = pub->data;
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x126630;
    secp256k1_musig_nonce_gen_internal_cold_1();
  }
  else {
    if (local_3f8 != 0x21) goto LAB_0012662b;
    pubkey = (secp256k1_pubkey *)(local_3e8 + 0x30);
    pk33 = local_3e8;
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x1263a4;
    puVar3 = seckey;
    msg32_00 = r;
    secp256k1_nonce_function_musig
              ((secp256k1_scalar *)pubkey,input_nonce,msg32,seckey,pk33,r->data,extra_input32);
    psStack_450 = (secp256k1_keyagg_cache_internal *)0x1263ac;
    psVar5 = (secp256k1_keyagg_cache_internal *)pubkey;
    secp256k1_scalar_verify((secp256k1_scalar *)pubkey);
    auVar8._0_4_ = -(uint)(local_3e8._48_4_ == 0 && local_3a8 == 0);
    auVar8._4_4_ = -(uint)(iStack_3b4 == 0 && iStack_3a4 == 0);
    auVar8._8_4_ = -(uint)(iStack_3b0 == 0 && iStack_3a0 == 0);
    auVar8._12_4_ = -(uint)(iStack_3ac == 0 && iStack_39c == 0);
    iVar2 = movmskps(extraout_EAX,auVar8);
    if (iVar2 != 0xf) {
      psVar5 = (secp256k1_keyagg_cache_internal *)local_398;
      psStack_450 = (secp256k1_keyagg_cache_internal *)0x1263da;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar5);
      psVar7 = local_3f0;
      auVar9._0_4_ = -(uint)(local_398._0_4_ == 0 && local_398._16_4_ == 0);
      auVar9._4_4_ = -(uint)(local_398._4_4_ == 0 && local_398._20_4_ == 0);
      auVar9._8_4_ = -(uint)(local_398._8_4_ == 0 && local_398._24_4_ == 0);
      auVar9._12_4_ = -(uint)(local_398._12_4_ == 0 && local_398._28_4_ == 0);
      iVar2 = movmskps(extraout_EAX_00,auVar9);
      if (iVar2 != 0xf) {
        psStack_450 = (secp256k1_keyagg_cache_internal *)0x126426;
        secp256k1_musig_secnonce_save(local_3f0,(secp256k1_scalar *)pubkey,&local_358.pk);
        psStack_450 = (secp256k1_keyagg_cache_internal *)0x126438;
        secp256k1_musig_secnonce_invalidate(ctx,psVar7,local_43c ^ 1);
        psVar5 = (secp256k1_keyagg_cache_internal *)local_168;
        bVar1 = true;
        do {
          bVar6 = bVar1;
          psVar4 = (secp256k1_keyagg_cache_internal *)pubkey;
          psStack_450 = (secp256k1_keyagg_cache_internal *)0x126453;
          secp256k1_ecmult_gen
                    (&ctx->ecmult_gen_ctx,(secp256k1_gej *)psVar5,(secp256k1_scalar *)psVar4);
          (psVar4->pk).x.n[2] = 0;
          (psVar4->pk).x.n[3] = 0;
          (psVar4->pk).x.n[0] = 0;
          (psVar4->pk).x.n[1] = 0;
          local_428.d[0] = 0x4d430001;
          local_428.d[2] = 0x20;
          local_428.d[3] = 0;
          local_408 = 0;
          local_400 = 0;
          pubkey = (secp256k1_pubkey *)local_398;
          psVar5 = (secp256k1_keyagg_cache_internal *)(local_168 + 0x98);
          bVar1 = false;
          local_428.d[1] = (uint64_t)psVar4;
        } while (bVar6);
        psStack_450 = (secp256k1_keyagg_cache_internal *)0x1264da;
        secp256k1_ge_set_all_gej((secp256k1_ge *)local_238,(secp256k1_gej *)local_168,2);
        psVar5 = (secp256k1_keyagg_cache_internal *)local_168;
        bVar1 = true;
        do {
          bVar6 = bVar1;
          psVar4 = psVar5;
          psStack_450 = (secp256k1_keyagg_cache_internal *)0x1264f1;
          memset(psVar4,0,0x98);
          local_428.d[0] = 0x4d430001;
          local_428.d[2] = 0x98;
          local_428.d[3] = 0;
          local_408 = 0;
          local_400 = 0;
          psVar5 = (secp256k1_keyagg_cache_internal *)(local_168 + 0x98);
          bVar1 = false;
          local_428.d[1] = (uint64_t)psVar4;
        } while (bVar6);
        psVar5 = (secp256k1_keyagg_cache_internal *)local_238;
        bVar1 = true;
        do {
          bVar6 = bVar1;
          if (ctx->declassify != 0) {
            local_428.d[0] = 0x4d430002;
            local_428.d[2] = 0x68;
            local_428.d[1] = (uint64_t)psVar5;
          }
          local_400 = 0;
          local_408 = 0;
          local_428.d[3] = 0;
          psVar5 = (secp256k1_keyagg_cache_internal *)(local_238 + 0x68);
          bVar1 = false;
        } while (bVar6);
        pubnonce->data[0] = 0xf5;
        pubnonce->data[1] = 'z';
        pubnonce->data[2] = '=';
        pubnonce->data[3] = 0xa0;
        psStack_450 = (secp256k1_keyagg_cache_internal *)0x1265da;
        secp256k1_ge_to_bytes(pubnonce->data + 4,(secp256k1_ge *)local_238);
        psStack_450 = (secp256k1_keyagg_cache_internal *)0x1265e9;
        secp256k1_ge_to_bytes(pubnonce->data + 0x44,(secp256k1_ge *)(local_238 + 0x68));
        return local_43c;
      }
      goto LAB_00126635;
    }
  }
  psStack_450 = (secp256k1_keyagg_cache_internal *)0x126635;
  secp256k1_musig_nonce_gen_internal_cold_3();
LAB_00126635:
  psStack_450 = (secp256k1_keyagg_cache_internal *)secp256k1_musig_nonce_gen_counter;
  secp256k1_musig_nonce_gen_internal_cold_2();
  auStack_510[2] = 0;
  auStack_510[3] = 0;
  auStack_510[0] = 0;
  auStack_510[1] = 0;
  psStack_478 = pubnonce;
  puStack_470 = seckey;
  psStack_468 = r;
  psStack_460 = ctx;
  psStack_458 = psVar7;
  psStack_450 = (secp256k1_keyagg_cache_internal *)pubkey;
  if (psVar5 == (secp256k1_keyagg_cache_internal *)0x0) {
    secp256k1_musig_nonce_gen_counter_cold_3();
  }
  else if ((secp256k1_musig_secnonce *)input_nonce != (secp256k1_musig_secnonce *)0x0) {
    memset(input_nonce,0,0x84);
    if (pk33 == (uchar *)0x0) {
      secp256k1_musig_nonce_gen_counter_cold_1();
      return 0;
    }
    auStack_510[0] =
         (ulong)puVar3 >> 0x38 | ((ulong)puVar3 & 0xff000000000000) >> 0x28 |
         ((ulong)puVar3 & 0xff0000000000) >> 0x18 | ((ulong)puVar3 & 0xff00000000) >> 8 |
         ((ulong)puVar3 & 0xff000000) << 8 | ((ulong)puVar3 & 0xff0000) << 0x18 |
         ((ulong)puVar3 & 0xff00) << 0x28 | (long)puVar3 << 0x38;
    uStack_530 = *(undefined8 *)pk33;
    uStack_528 = *(undefined8 *)(pk33 + 8);
    uStack_520 = *(undefined8 *)(pk33 + 0x10);
    uStack_518 = *(undefined8 *)(pk33 + 0x18);
    sStack_4c0.data._0_8_ = *(undefined8 *)(pk33 + 0x20);
    sStack_4c0.data._8_8_ = *(undefined8 *)(pk33 + 0x28);
    sStack_4c0.data._16_8_ = *(undefined8 *)(pk33 + 0x30);
    sStack_4c0.data._24_8_ = *(undefined8 *)(pk33 + 0x38);
    sStack_4c0.data._32_8_ = *(undefined8 *)(pk33 + 0x40);
    sStack_4c0.data._40_8_ = *(undefined8 *)(pk33 + 0x48);
    sStack_4c0.data._48_8_ = *(undefined8 *)(pk33 + 0x50);
    sStack_4c0.data._56_8_ = *(undefined8 *)(pk33 + 0x58);
    iVar2 = secp256k1_musig_nonce_gen_internal
                      ((secp256k1_context *)psVar5,(secp256k1_musig_secnonce *)input_nonce,
                       pubnonce_00,(uchar *)auStack_510,(uchar *)&uStack_530,&sStack_4c0,
                       msg32_00->data,(secp256k1_musig_keyagg_cache *)CONCAT44(local_43c,uStack_440)
                       ,local_438);
    if (iVar2 != 0) {
      return 1;
    }
    return 0;
  }
  secp256k1_musig_nonce_gen_counter_cold_2();
  return 0;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}